

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_compile_trailers(curl_slist *trailers,Curl_send_buffer *buffer,Curl_easy *handle)

{
  ulong uVar1;
  char *__s;
  char *pcVar2;
  CURLcode CVar3;
  char *pcVar4;
  Curl_send_buffer *local_38;
  
  uVar1 = *(ulong *)&(handle->set).field_0x878;
  pcVar2 = " \t\n";
  if ((uVar1 & 0x840) == 0) {
    pcVar2 = " \t\r\n";
  }
  local_38 = buffer;
  if (trailers != (curl_slist *)0x0) {
    do {
      __s = trailers->data;
      pcVar4 = strchr(__s,0x3a);
      if ((pcVar4 == (char *)0x0) || (pcVar4[1] != ' ')) {
        Curl_infof(handle,"Malformatted trailing header ! Skipping trailer.");
      }
      else {
        CVar3 = Curl_add_bufferf(&local_38,"%s%s",__s,pcVar2 + 2);
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
      }
      trailers = trailers->next;
    } while (trailers != (curl_slist *)0x0);
  }
  CVar3 = Curl_add_buffer(&local_38,pcVar2 + 2,(ulong)((uVar1 & 0x840) == 0) + 1);
  return CVar3;
}

Assistant:

CURLcode Curl_http_compile_trailers(struct curl_slist *trailers,
                                    Curl_send_buffer *buffer,
                                    struct Curl_easy *handle)
{
  char *ptr = NULL;
  CURLcode result = CURLE_OK;
  const char *endofline_native = NULL;
  const char *endofline_network = NULL;

  if(
#ifdef CURL_DO_LINEEND_CONV
     (handle->set.prefer_ascii) ||
#endif
     (handle->set.crlf)) {
    /* \n will become \r\n later on */
    endofline_native  = "\n";
    endofline_network = "\x0a";
  }
  else {
    endofline_native  = "\r\n";
    endofline_network = "\x0d\x0a";
  }

  while(trailers) {
    /* only add correctly formatted trailers */
    ptr = strchr(trailers->data, ':');
    if(ptr && *(ptr + 1) == ' ') {
      result = Curl_add_bufferf(&buffer, "%s%s", trailers->data,
                                endofline_native);
      if(result)
        return result;
    }
    else
      infof(handle, "Malformatted trailing header ! Skipping trailer.");
    trailers = trailers->next;
  }
  result = Curl_add_buffer(&buffer, endofline_network,
                           strlen(endofline_network));
  return result;
}